

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

string * __thiscall
cmCPackIFWPackage::DependenceStruct::NameWithCompare_abi_cxx11_
          (string *__return_storage_ptr__,DependenceStruct *this)

{
  ulong uVar1;
  DependenceStruct *this_local;
  string *result;
  
  if ((this->Compare).Type == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
    if (((this->Compare).Type != 0) || (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"-");
    }
    if ((this->Compare).Type == 3) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"<=");
    }
    else if ((this->Compare).Type == 5) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,">=");
    }
    else if ((this->Compare).Type == 2) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"<");
    }
    else if ((this->Compare).Type == 1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"=");
    }
    else if ((this->Compare).Type == 4) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,">");
    }
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)&(this->Compare).Value);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWPackage::DependenceStruct::NameWithCompare() const
{
  if (this->Compare.Type == cmCPackIFWPackage::CompareNone) {
    return this->Name;
  }

  std::string result = this->Name;

  if (this->Compare.Type != cmCPackIFWPackage::CompareNone ||
      !this->Compare.Value.empty()) {
    result += "-";
  }

  if (this->Compare.Type == cmCPackIFWPackage::CompareLessOrEqual) {
    result += "<=";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareGreaterOrEqual) {
    result += ">=";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareLess) {
    result += "<";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareEqual) {
    result += "=";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareGreater) {
    result += ">";
  }

  result += this->Compare.Value;

  return result;
}